

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char **ppcVar2;
  char cVar3;
  int iVar4;
  vec<Minisat::Option_*,_int> *pvVar5;
  gzFile i;
  FILE *__s;
  long lVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  bool bVar12;
  rusage ru;
  BoolOption strictp;
  IntOption mem_lim;
  IntOption cpu_lim;
  IntOption verb;
  Solver S;
  int local_538;
  int local_534;
  double local_530;
  double local_528;
  Lit local_51c;
  vec<Minisat::Lit,_int> local_518;
  gzFile local_508;
  char **local_500;
  rusage local_4f8;
  Option local_468;
  char local_440;
  Option local_438;
  undefined8 local_410;
  int local_408;
  Option local_400;
  undefined8 local_3d8;
  uint local_3d0;
  Option local_3c8;
  undefined8 local_3a0;
  int local_398;
  Option *local_390;
  long local_388;
  int local_350;
  uint local_2a8;
  vec<Minisat::Lit,_int> local_238 [20];
  uint local_ec;
  
  local_538 = argc;
  Minisat::setUsageHelp
            (
            "USAGE: %s [options] <input-file> <result-output-file>\n\n  where input may be either in plain or gzipped DIMACS.\n"
            );
  Minisat::setX86FPUPrecision();
  local_3c8._vptr_Option = (_func_int **)&PTR__Option_00105d28;
  local_3c8.name = "verb";
  local_3c8.description = "Verbosity level (0=silent, 1=some, 2=more).";
  local_3c8.category = "MAIN";
  local_3c8.type_name = "<int32>";
  pvVar5 = Minisat::Option::getOptionList();
  local_390 = &local_3c8;
  Minisat::vec<Minisat::Option_*,_int>::push(pvVar5,&local_390);
  local_3c8._vptr_Option = (_func_int **)&PTR__Option_00105cd0;
  local_3a0 = 0x200000000;
  local_398 = 1;
  local_400._vptr_Option = (_func_int **)&PTR__Option_00105d28;
  local_400.name = "cpu-lim";
  local_400.description = "Limit on CPU time allowed in seconds.\n";
  local_400.category = "MAIN";
  local_400.type_name = "<int32>";
  pvVar5 = Minisat::Option::getOptionList();
  local_390 = &local_400;
  Minisat::vec<Minisat::Option_*,_int>::push(pvVar5,&local_390);
  local_400._vptr_Option = (_func_int **)&PTR__Option_00105cd0;
  local_3d8 = 0x7fffffff00000000;
  local_3d0 = 0;
  local_438._vptr_Option = (_func_int **)&PTR__Option_00105d28;
  local_438.name = "mem-lim";
  local_438.description = "Limit on memory usage in megabytes.\n";
  local_438.category = "MAIN";
  local_438.type_name = "<int32>";
  pvVar5 = Minisat::Option::getOptionList();
  local_390 = &local_438;
  Minisat::vec<Minisat::Option_*,_int>::push(pvVar5,&local_390);
  local_438._vptr_Option = (_func_int **)&PTR__Option_00105cd0;
  local_410 = 0x7fffffff00000000;
  local_408 = 0;
  local_468._vptr_Option = (_func_int **)&PTR__Option_00105d28;
  local_468.name = "strict";
  local_468.description = "Validate DIMACS header during parsing.";
  local_468.category = "MAIN";
  local_468.type_name = "<bool>";
  pvVar5 = Minisat::Option::getOptionList();
  local_390 = &local_468;
  Minisat::vec<Minisat::Option_*,_int>::push(pvVar5,&local_390);
  local_468._vptr_Option = (_func_int **)&PTR__Option_00105d58;
  local_440 = '\0';
  Minisat::parseOptions(&local_538,argv,true);
  Minisat::Solver::Solver((Solver *)&local_390);
  getrusage(RUSAGE_SELF,&local_4f8);
  local_528 = (double)local_4f8.ru_utime.tv_sec;
  local_530 = (double)local_4f8.ru_utime.tv_usec;
  local_350 = local_398;
  solver = (Solver *)&local_390;
  Minisat::sigTerm(SIGINT_exit);
  if (local_3d0 != 0) {
    Minisat::limitTime(local_3d0);
  }
  if ((long)local_408 != 0) {
    Minisat::limitMemory((long)local_408);
  }
  if ((local_538 == 1) &&
     (puts("Reading from standard input... Use \'--help\' for help."), local_538 == 1)) {
    i = (gzFile)gzdopen(0,"rb");
  }
  else {
    i = (gzFile)gzopen(argv[1],"rb");
  }
  if (i == (gzFile)0x0) {
    if (local_538 == 1) {
      pcVar11 = "<stdin>";
    }
    else {
      pcVar11 = argv[1];
    }
    printf("ERROR! Could not open file: %s\n",pcVar11);
    exit(1);
  }
  if (0 < local_350) {
    puts("============================[ Problem Statistics ]=============================");
    puts("|                                                                             |");
  }
  cVar3 = local_440;
  Minisat::StreamBuffer::StreamBuffer((StreamBuffer *)&local_4f8,i);
  local_530 = local_530 / 1000000.0 + local_528;
  local_518.data = (Lit *)0x0;
  local_518.sz = 0;
  local_518.cap = 0;
  iVar8 = 0;
  local_534 = 0;
  local_508 = i;
  local_500 = argv;
LAB_001029e8:
  do {
    Minisat::skipWhitespace<Minisat::StreamBuffer>((StreamBuffer *)&local_4f8);
    if (local_4f8.ru_stime.tv_sec._4_4_ <= (int)local_4f8.ru_stime.tv_sec) {
      if ((cVar3 != '\0') && (iVar8 != local_534)) {
        puts("PARSE ERROR! DIMACS header mismatch: wrong number of clauses");
      }
      ppcVar2 = local_500;
      if (local_518.data != (Lit *)0x0) {
        local_518._8_8_ = local_518._8_8_ & 0xffffffff00000000;
        free(local_518.data);
      }
      free((void *)local_4f8.ru_utime.tv_usec);
      gzclose();
      if (local_538 < 3) {
        __s = (FILE *)0x0;
      }
      else {
        __s = fopen(ppcVar2[2],"wb");
      }
      if (0 < local_350) {
        printf("|  Number of variables:  %12d                                         |\n",
               (ulong)local_ec);
        printf("|  Number of clauses:    %12d                                         |\n",
               (ulong)local_2a8);
      }
      getrusage(RUSAGE_SELF,&local_4f8);
      if (0 < local_350) {
        printf("|  Parse time:           %12.2f s                                       |\n",
               SUB84(((double)local_4f8.ru_utime.tv_sec +
                     (double)local_4f8.ru_utime.tv_usec / 1000000.0) - local_530,0));
        puts("|                                                                             |");
      }
      Minisat::sigTerm(SIGINT_interrupt);
      cVar3 = Minisat::Solver::simplify();
      if (cVar3 == '\0') {
        if (__s != (FILE *)0x0) {
          fwrite("UNSAT\n",6,1,__s);
          fclose(__s);
        }
        if (0 < local_350) {
          puts("===============================================================================");
          puts("Solved by unit propagation");
          Minisat::Solver::printStats();
          putchar(10);
        }
        puts("UNSATISFIABLE");
        exit(0x14);
      }
      local_4f8.ru_utime.tv_sec = 0;
      local_4f8.ru_utime.tv_usec = 0;
      Minisat::vec<Minisat::Lit,_int>::copyTo((vec<Minisat::Lit,_int> *)&local_4f8,local_238);
      cVar3 = Minisat::Solver::solve_();
      if (0 < local_350) {
        Minisat::Solver::printStats();
        putchar(10);
      }
      if (cVar3 == '\0') {
        puts("SATISFIABLE");
        iVar8 = 10;
        if (__s != (FILE *)0x0) {
          fwrite("SAT\n",4,1,__s);
          if (0 < (int)local_ec) {
            lVar6 = 0;
            uVar10 = local_ec;
            do {
              if ((*(byte *)(local_388 + lVar6) & 2) == 0) {
                pcVar11 = " ";
                if (lVar6 == 0) {
                  pcVar11 = "";
                }
                pcVar7 = "";
                if (*(byte *)(local_388 + lVar6) != 0) {
                  pcVar7 = "-";
                }
                fprintf(__s,"%s%s%d",pcVar11,pcVar7,lVar6 + 1U & 0xffffffff);
                uVar10 = local_ec;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < (int)uVar10);
          }
          fwrite(" 0\n",3,1,__s);
          fclose(__s);
        }
      }
      else {
        pcVar11 = "INDETERMINATE\n";
        if (cVar3 == '\x01') {
          pcVar11 = "UNSATISFIABLE\n";
        }
        printf(pcVar11);
        if (__s != (FILE *)0x0) {
          pcVar11 = "INDET\n";
          if (cVar3 == '\x01') {
            pcVar11 = "UNSAT\n";
          }
          fwrite(pcVar11,6,1,__s);
          fclose(__s);
        }
        iVar8 = 0x14;
        if (cVar3 != '\x01') {
          iVar8 = 0;
        }
      }
      if ((void *)local_4f8.ru_utime.tv_sec != (void *)0x0) {
        local_4f8.ru_utime.tv_usec = local_4f8.ru_utime.tv_usec & 0xffffffff00000000;
        free((void *)local_4f8.ru_utime.tv_sec);
      }
      Minisat::Solver::~Solver((Solver *)&local_390);
      return iVar8;
    }
    if (*(char *)(local_4f8.ru_utime.tv_usec + (int)local_4f8.ru_stime.tv_sec) == 'p') {
      lVar6 = 1;
      bVar12 = false;
      cVar1 = 'p';
      iVar4 = local_4f8.ru_stime.tv_sec._4_4_;
      do {
        uVar10 = 0xffffffff;
        if ((int)local_4f8.ru_stime.tv_sec < iVar4) {
          uVar10 = (uint)*(byte *)(local_4f8.ru_utime.tv_usec + (int)local_4f8.ru_stime.tv_sec);
        }
        if (uVar10 != (int)cVar1) break;
        local_4f8.ru_stime.tv_sec._0_4_ = (int)local_4f8.ru_stime.tv_sec + 1;
        if (iVar4 <= (int)local_4f8.ru_stime.tv_sec) {
          local_4f8.ru_stime.tv_sec._0_4_ = 0;
          local_4f8.ru_stime.tv_sec._4_4_ =
               gzread(local_4f8.ru_utime.tv_sec,local_4f8.ru_utime.tv_usec,0x10000);
          iVar4 = local_4f8.ru_stime.tv_sec._4_4_;
        }
        cVar1 = "p cnf"[lVar6];
        bVar12 = cVar1 == '\0';
        lVar6 = lVar6 + 1;
      } while (lVar6 != 6);
      if (!bVar12) {
        uVar9 = 0xffffffff;
        if ((int)local_4f8.ru_stime.tv_sec < iVar4) {
          uVar9 = (ulong)*(byte *)(local_4f8.ru_utime.tv_usec + (int)local_4f8.ru_stime.tv_sec);
        }
        printf("PARSE ERROR! Unexpected char: %c\n",uVar9);
        exit(3);
      }
      Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&local_4f8);
      local_534 = Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&local_4f8);
      goto LAB_001029e8;
    }
    iVar4 = local_4f8.ru_stime.tv_sec._4_4_;
    if (*(char *)(local_4f8.ru_utime.tv_usec + (int)local_4f8.ru_stime.tv_sec) == 'c') {
      do {
        lVar6 = (long)(int)local_4f8.ru_stime.tv_sec;
        local_4f8.ru_stime.tv_sec._0_4_ = (int)local_4f8.ru_stime.tv_sec + 1;
        if (*(char *)(local_4f8.ru_utime.tv_usec + lVar6) == '\n') {
          if (iVar4 <= (int)local_4f8.ru_stime.tv_sec) {
            local_4f8.ru_stime.tv_sec._0_4_ = 0;
            local_4f8.ru_stime.tv_sec._4_4_ =
                 gzread(local_4f8.ru_utime.tv_sec,local_4f8.ru_utime.tv_usec,0x10000);
          }
          break;
        }
        if (iVar4 <= (int)local_4f8.ru_stime.tv_sec) {
          local_4f8.ru_stime.tv_sec._0_4_ = 0;
          local_4f8.ru_stime.tv_sec._4_4_ =
               gzread(local_4f8.ru_utime.tv_sec,local_4f8.ru_utime.tv_usec,0x10000);
          iVar4 = local_4f8.ru_stime.tv_sec._4_4_;
        }
      } while ((int)local_4f8.ru_stime.tv_sec < iVar4);
    }
    else {
      if (local_518.data != (Lit *)0x0) {
        local_518._8_8_ = local_518._8_8_ & 0xffffffff00000000;
      }
      iVar4 = Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&local_4f8);
      local_528 = (double)CONCAT44(local_528._4_4_,iVar8);
      while (iVar4 != 0) {
        iVar8 = -iVar4;
        if (0 < iVar4) {
          iVar8 = iVar4;
        }
        while ((int)local_ec < iVar8) {
          Minisat::Solver::newVar((lbool)(uint8_t)(vec *)&local_390,true);
        }
        local_51c.x = ((iVar4 < 1) - 2) + iVar8 * 2;
        Minisat::vec<Minisat::Lit,_int>::push(&local_518,&local_51c);
        iVar4 = Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&local_4f8);
      }
      iVar8 = local_528._0_4_ + 1;
      Minisat::Solver::addClause_((vec *)&local_390);
    }
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    try {
        setUsageHelp("USAGE: %s [options] <input-file> <result-output-file>\n\n  where input may be either in plain or gzipped DIMACS.\n");
        setX86FPUPrecision();

        // Extra options:
        //
        IntOption    verb   ("MAIN", "verb",   "Verbosity level (0=silent, 1=some, 2=more).", 1, IntRange(0, 2));
        IntOption    cpu_lim("MAIN", "cpu-lim","Limit on CPU time allowed in seconds.\n", 0, IntRange(0, INT32_MAX));
        IntOption    mem_lim("MAIN", "mem-lim","Limit on memory usage in megabytes.\n", 0, IntRange(0, INT32_MAX));
        BoolOption   strictp("MAIN", "strict", "Validate DIMACS header during parsing.", false);
        
        parseOptions(argc, argv, true);

        Solver S;
        double initial_time = cpuTime();

        S.verbosity = verb;
        
        solver = &S;
        // Use signal handlers that forcibly quit until the solver will be able to respond to
        // interrupts:
        sigTerm(SIGINT_exit);

        // Try to set resource limits:
        if (cpu_lim != 0) limitTime(cpu_lim);
        if (mem_lim != 0) limitMemory(mem_lim);
        
        if (argc == 1)
            printf("Reading from standard input... Use '--help' for help.\n");
        
        gzFile in = (argc == 1) ? gzdopen(0, "rb") : gzopen(argv[1], "rb");
        if (in == NULL)
            printf("ERROR! Could not open file: %s\n", argc == 1 ? "<stdin>" : argv[1]), exit(1);
        
        if (S.verbosity > 0){
            printf("============================[ Problem Statistics ]=============================\n");
            printf("|                                                                             |\n"); }
        
        parse_DIMACS(in, S, (bool)strictp);
        gzclose(in);
        FILE* res = (argc >= 3) ? fopen(argv[2], "wb") : NULL;
        
        if (S.verbosity > 0){
            printf("|  Number of variables:  %12d                                         |\n", S.nVars());
            printf("|  Number of clauses:    %12d                                         |\n", S.nClauses()); }
        
        double parsed_time = cpuTime();
        if (S.verbosity > 0){
            printf("|  Parse time:           %12.2f s                                       |\n", parsed_time - initial_time);
            printf("|                                                                             |\n"); }
 
        // Change to signal-handlers that will only notify the solver and allow it to terminate
        // voluntarily:
        sigTerm(SIGINT_interrupt);
       
        if (!S.simplify()){
            if (res != NULL) fprintf(res, "UNSAT\n"), fclose(res);
            if (S.verbosity > 0){
                printf("===============================================================================\n");
                printf("Solved by unit propagation\n");
                S.printStats();
                printf("\n"); }
            printf("UNSATISFIABLE\n");
            exit(20);
        }
        
        vec<Lit> dummy;
        lbool ret = S.solveLimited(dummy);
        if (S.verbosity > 0){
            S.printStats();
            printf("\n"); }
        printf(ret == l_True ? "SATISFIABLE\n" : ret == l_False ? "UNSATISFIABLE\n" : "INDETERMINATE\n");
        if (res != NULL){
            if (ret == l_True){
                fprintf(res, "SAT\n");
                for (int i = 0; i < S.nVars(); i++)
                    if (S.model[i] != l_Undef)
                        fprintf(res, "%s%s%d", (i==0)?"":" ", (S.model[i]==l_True)?"":"-", i+1);
                fprintf(res, " 0\n");
            }else if (ret == l_False)
                fprintf(res, "UNSAT\n");
            else
                fprintf(res, "INDET\n");
            fclose(res);
        }
        
#ifdef NDEBUG
        exit(ret == l_True ? 10 : ret == l_False ? 20 : 0);     // (faster than "return", which will invoke the destructor for 'Solver')
#else
        return (ret == l_True ? 10 : ret == l_False ? 20 : 0);
#endif
    } catch (OutOfMemoryException&){
        printf("===============================================================================\n");
        printf("INDETERMINATE\n");
        exit(0);
    }
}